

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Processor *p)

{
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *pvVar1;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> structs;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions;
  uint32_t uVar2;
  Expression *latency;
  Annotation AStack_48;
  
  (this->sourceProcessor).object = p;
  if ((p->latency).object != (Expression *)0x0) {
    latency = pool_ptr<soul::AST::Expression>::operator*(&p->latency);
    uVar2 = SanityCheckPass::checkLatency(latency);
    this->module->latency = uVar2;
  }
  pvVar1 = &(p->super_ProcessorBase).super_ModuleBase.structures;
  structs.s = (pvVar1->
              super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  structs.e = (pvVar1->
              super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  generateStructs(this,structs);
  AST::Annotation::toPlainAnnotation
            (&AStack_48,&(p->super_ProcessorBase).annotation,
             &((this->module->program).pimpl)->stringDictionary);
  Annotation::operator=(&this->module->annotation,&AStack_48);
  Annotation::~Annotation(&AStack_48);
  this->parsingStateVariables = true;
  ASTVisitor::visit(&this->super_ASTVisitor,p);
  this->parsingStateVariables = false;
  functions.s = (p->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  functions.e = (p->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  generateFunctions(this,functions);
  return;
}

Assistant:

void visit (AST::Processor& p) override
    {
        sourceProcessor = p;

        if (p.latency != nullptr)
            module.latency = SanityCheckPass::checkLatency (*p.latency);

        generateStructs (p.structures);

        module.annotation = p.annotation.toPlainAnnotation (module.program.getStringDictionary());

        parsingStateVariables = true;
        super::visit (p);
        parsingStateVariables = false;

        generateFunctions (p.functions);
    }